

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

void P_BringUpWeapon(player_t *player)

{
  double dVar1;
  int iVar2;
  AWeapon *pAVar3;
  AWeapon *pAVar4;
  APlayerPawn *ent;
  AInventory *pAVar5;
  DPSprite *pDVar6;
  FState *pFVar7;
  AWeapon *this;
  FSoundID local_24;
  
  pAVar3 = player->PendingWeapon;
  if (pAVar3 == (AWeapon *)AWeapon::RegistrationInfo.MyClass) {
    if (player->ReadyWeapon == (AWeapon *)0x0) {
      return;
    }
    pDVar6 = player_t::GetPSprite(player,PSP_WEAPON);
    pDVar6->y = 32.0;
    pFVar7 = AWeapon::GetReadyState(player->ReadyWeapon);
    pDVar6 = player_t::GetPSprite(player,PSP_WEAPON);
    DPSprite::SetState(pDVar6,pFVar7,false);
    return;
  }
  if (pAVar3 == (AWeapon *)0x0) goto LAB_00438e4e;
  pAVar4 = (pAVar3->SisterWeapon).field_0.p;
  this = pAVar3;
  if (pAVar4 != (AWeapon *)0x0) {
    if (((pAVar4->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
         ObjectFlags & 0x20) == 0) {
      if ((((pAVar4->super_AStateProvider).super_AInventory.field_0x4fd & 4) != 0) &&
         (pAVar5 = AActor::FindInventory
                             (&player->mo->super_AActor,
                              (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true),
         pAVar5 != (AInventory *)0x0)) {
        this = (pAVar3->SisterWeapon).field_0.p;
        if (this != (AWeapon *)0x0) {
          if (((this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
               super_DObject.ObjectFlags & 0x20) == 0) goto LAB_00438ee1;
          (pAVar3->SisterWeapon).field_0.p = (AWeapon *)0x0;
        }
LAB_00438e4e:
        player->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
        player->ReadyWeapon = (AWeapon *)0x0;
        (player->mo->super_AActor).weaponspecial = 0;
        return;
      }
    }
    else {
      (pAVar3->SisterWeapon).field_0.p = (AWeapon *)0x0;
    }
  }
LAB_00438ee1:
  player->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
  player->ReadyWeapon = this;
  ent = player->mo;
  (ent->super_AActor).weaponspecial = 0;
  iVar2 = (this->UpSound).super_FSoundID.ID;
  if (iVar2 != 0) {
    local_24.ID = iVar2;
    S_Sound(&ent->super_AActor,1,&local_24,1.0,1.0);
  }
  player->refire = 0;
  dVar1 = *(double *)(&DAT_00605220 + (ulong)(((uint)player->cheats >> 0xb & 1) == 0) * 8);
  pDVar6 = player_t::GetPSprite(player,PSP_WEAPON);
  pDVar6->y = dVar1;
  pDVar6 = player_t::GetPSprite(player,PSP_FLASH);
  DPSprite::SetState(pDVar6,(FState *)0x0,false);
  pFVar7 = AWeapon::GetUpState(this);
  pDVar6 = player_t::GetPSprite(player,PSP_WEAPON);
  DPSprite::SetState(pDVar6,pFVar7,false);
  return;
}

Assistant:

void P_BringUpWeapon (player_t *player)
{
	AWeapon *weapon;

	if (player->PendingWeapon == WP_NOCHANGE)
	{
		if (player->ReadyWeapon != nullptr)
		{
			player->GetPSprite(PSP_WEAPON)->y = WEAPONTOP;
			P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->GetReadyState());
		}
		return;
	}

	weapon = player->PendingWeapon;

	// If the player has a tome of power, use this weapon's powered up
	// version, if one is available.
	if (weapon != nullptr &&
		weapon->SisterWeapon &&
		weapon->SisterWeapon->WeaponFlags & WIF_POWERED_UP &&
		player->mo->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true))
	{
		weapon = weapon->SisterWeapon;
	}

	player->PendingWeapon = WP_NOCHANGE;
	player->ReadyWeapon = weapon;
	player->mo->weaponspecial = 0;

	if (weapon != nullptr)
	{
		if (weapon->UpSound)
		{
			S_Sound (player->mo, CHAN_WEAPON, weapon->UpSound, 1, ATTN_NORM);
		}
		player->refire = 0;

		player->GetPSprite(PSP_WEAPON)->y = player->cheats & CF_INSTANTWEAPSWITCH
			? WEAPONTOP : WEAPONBOTTOM;
		// make sure that the previous weapon's flash state is terminated.
		// When coming here from a weapon drop it may still be active.
		P_SetPsprite(player, PSP_FLASH, nullptr);
		P_SetPsprite(player, PSP_WEAPON, weapon->GetUpState());
	}
}